

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::readPixels
          (ReferenceContext *this,int x,int y,int width,int height,deUint32 format,deUint32 type,
          void *data)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  int y_00;
  pointer puVar3;
  int iVar4;
  int width_00;
  int height_00;
  int x_00;
  TextureFormat local_100;
  MultisamplePixelBufferAccess src;
  MultisamplePixelBufferAccess local_d0;
  MultisampleConstPixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess dst;
  
  getReadColorbuffer(&src,this);
  local_100 = glu::mapGLTransferFormat(format,type);
  if (local_100.order == CHANNELORDER_LAST || local_100.type == CHANNELTYPE_LAST) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  else {
    iVar4 = x - src.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
    if (x < src.m_access.super_ConstPixelBufferAccess.m_size.m_data[1]) {
      src.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = x;
    }
    width_00 = -iVar4;
    x_00 = src.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
    if (x < 0) {
      x_00 = 0;
    }
    y_00 = src.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
    if (y < src.m_access.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      y_00 = y;
    }
    height_00 = -(y - src.m_access.super_ConstPixelBufferAccess.m_size.m_data[2]);
    if (y < 0) {
      y_00 = 0;
    }
    if (SBORROW4(width,width_00) != width + iVar4 < 0) {
      width_00 = width;
    }
    if (width < 0) {
      width_00 = 0;
    }
    if (SBORROW4(height,height_00) !=
        height + (y - src.m_access.super_ConstPixelBufferAccess.m_size.m_data[2]) < 0) {
      height_00 = height;
    }
    if (height < 0) {
      height_00 = 0;
    }
    iVar4 = tcu::TextureFormat::getPixelSize(&local_100);
    pDVar1 = this->m_pixelPackBufferBinding;
    if (pDVar1 != (DataBuffer *)0x0) {
      puVar2 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pointer)0x0;
      if (puVar2 != (pDVar1->m_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        puVar3 = puVar2;
      }
      data = (void *)((long)data + (long)puVar3);
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&dst,&local_100,width,height,1,
               -this->m_pixelPackAlignment & (iVar4 * width + this->m_pixelPackAlignment) - 1U,0,
               data);
    tcu::getSubregion(&local_80,&dst,0,0,width_00,height_00);
    rr::getSubregion(&local_d0,&src,x_00,y_00,width_00,height_00);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_a8,&local_d0);
    rr::resolveMultisampleColorBuffer(&local_80,&local_a8);
  }
  return;
}

Assistant:

void ReferenceContext::readPixels (int x, int y, int width, int height, deUint32 format, deUint32 type, void* data)
{
	rr::MultisamplePixelBufferAccess	src = getReadColorbuffer();
	TextureFormat						transferFmt;

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Clamp input values
	const int copyX			= deClamp32(x,		0, src.raw().getHeight());
	const int copyY			= deClamp32(y,		0, src.raw().getDepth());
	const int copyWidth		= deClamp32(width,	0, src.raw().getHeight()-x);
	const int copyHeight	= deClamp32(height,	0, src.raw().getDepth()-y);

	PixelBufferAccess dst(transferFmt, width, height, 1, deAlign32(width*transferFmt.getPixelSize(), m_pixelPackAlignment), 0, getPixelPackPtr(data));
	rr::resolveMultisampleColorBuffer(tcu::getSubregion(dst, 0, 0, copyWidth, copyHeight), rr::getSubregion(src, copyX, copyY, copyWidth, copyHeight));
}